

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O3

_Bool rtr_mgr_conf_in_sync(rtr_mgr_config *config)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  tommy_list ptVar4;
  _Bool _Var5;
  uint j;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&config->mutex);
  ptVar4 = (tommy_list)config->groups;
  do {
    ptVar4 = ptVar4->next;
    if (ptVar4 == (tommy_list)0x0) {
      _Var5 = false;
LAB_0010663b:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      return _Var5;
    }
    plVar3 = *(long **)((long)ptVar4->data + 0x20);
    uVar6 = 0;
    do {
      if (*(uint *)(plVar3 + 1) == uVar6) {
        _Var5 = true;
        goto LAB_0010663b;
      }
      lVar1 = uVar6 * 8;
      uVar6 = uVar6 + 1;
    } while (*(long *)(*(long *)(*plVar3 + lVar1) + 0x10) != 0);
  } while( true );
}

Assistant:

RTRLIB_EXPORT bool rtr_mgr_conf_in_sync(struct rtr_mgr_config *config)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		bool all_sync = true;
		struct rtr_mgr_group_node *group_node = node->data;

		for (unsigned int j = 0; all_sync && (j < group_node->group->sockets_len); j++) {
			if (group_node->group->sockets[j]->last_update == 0)
				all_sync = false;
		}
		if (all_sync) {
			pthread_rwlock_unlock(&config->mutex);
			return true;
		}
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
	return false;
}